

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O2

_Bool bitset_container_iterate
                (bitset_container_t *cont,uint32_t base,roaring_iterator iterator,void *ptr)

{
  long lVar1;
  _Bool _Var2;
  int32_t i;
  ulong uVar3;
  uint64_t uVar4;
  
  for (uVar3 = 0; uVar3 != 0x400; uVar3 = uVar3 + 1) {
    uVar4 = cont->words[uVar3];
    while (uVar4 != 0) {
      lVar1 = 0;
      if (uVar4 != 0) {
        for (; (uVar4 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
        }
      }
      _Var2 = (*iterator)((int)lVar1 + base,ptr);
      uVar4 = uVar4 & uVar4 - 1;
      if (!_Var2) goto LAB_0010967a;
    }
    base = base + 0x40;
  }
LAB_0010967a:
  return 0x3ff < uVar3;
}

Assistant:

bool bitset_container_iterate(const bitset_container_t *cont, uint32_t base, roaring_iterator iterator, void *ptr) {
  for (int32_t i = 0; i < BITSET_CONTAINER_SIZE_IN_WORDS; ++i ) {
    uint64_t w = cont->words[i];
    while (w != 0) {
      uint64_t t = w & (~w + 1);
      int r = roaring_trailing_zeroes(w);
      if(!iterator(r + base, ptr)) return false;
      w ^= t;
    }
    base += 64;
  }
  return true;
}